

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O1

void test_multi_clips(void)

{
  puts("Entering test_multi_clips:");
  printf("  Hit RETURN to clip giant red and blue rects to multi clip rgns: ");
  getchar();
  (**(code **)(*(long *)d1 + 0xe8))();
  (**(code **)(*(long *)d1 + 0x98))(d1,0,0,*(undefined4 *)(d1 + 0x10),*(undefined4 *)(d1 + 0x14));
  perceive_expose_event(d1,2,0x14,0x14,0x28,0x28);
  perceive_expose_event(d1,1,0x32,0x32,0x3c,0x28);
  perceive_expose_event(d1,0,0x78,0x50,0x28,0x28);
  (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,&red,0,0,300,200,0);
  perceive_expose_event(d1,1,200,0x14,0x50,0x28);
  perceive_expose_event(d1,0,0xdc,0x50,0x28,0x28);
  (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,&blue,0,0,300,200,0);
  (**(code **)(*(long *)d1 + 0xa0))();
  printf("  Hit RETURN to set clip regions in multiple windows: ");
  getchar();
  (**(code **)(*(long *)d1 + 0xe8))();
  (**(code **)(*(long *)d1 + 0x98))(d1,0,0,*(undefined4 *)(d1 + 0x10),*(undefined4 *)(d1 + 0x14));
  (**(code **)(*(long *)d2 + 0xe8))();
  (**(code **)(*(long *)d2 + 0x98))(d2,0,0,*(undefined4 *)(d2 + 0x10),*(undefined4 *)(d2 + 0x14));
  perceive_expose_event(d1,1,0x1e,0x14,0x3c,0x3c);
  perceive_expose_event(d1,0,10,100,100,0x32);
  (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,&purple,0,0,300,200,0);
  perceive_expose_event(d2,1,200,0x14,0x3c,0x3c);
  perceive_expose_event(d2,0,0xb4,100,100,0x32);
  (**(code **)(*(long *)d2 + 0x160))(d2,&Am_No_Style,&green,0,0,300,200,0);
  (**(code **)(*(long *)d1 + 0xa0))();
  (**(code **)(*(long *)d2 + 0xa0))();
  return;
}

Assistant:

void
test_multi_clips()
{
  printf("Entering test_multi_clips:\n");
  printf("  Hit RETURN to clip giant red and blue rects to multi clip rgns: ");
  getchar();

  d1->Clear_Clip();
  clear_whole_window(d1);
  perceive_expose_event(d1, 2, 20, 20, 40, 40);
  perceive_expose_event(d1, 1, 50, 50, 60, 40);
  perceive_expose_event(d1, 0, 120, 80, 40, 40);
  d1->Draw_Rectangle(Am_No_Style, red, 0, 0, 300, 200);

  perceive_expose_event(d1, 1, 200, 20, 80, 40);
  perceive_expose_event(d1, 0, 220, 80, 40, 40);
  d1->Draw_Rectangle(Am_No_Style, blue, 0, 0, 300, 200);
  d1->Flush_Output();

  // In the next set of clips and draws, you should expect the clip regions
  // in the two windows to remain distinct.  That is, drawing will only
  // occur on the left side of d1, and will only occur on the right side
  // of d2.  Note: you cannot mix non-zero expose event counts across
  // multiple windows.  "All the Expose events generated by a single action
  // are guaranteed to be contiguous in the event queue."
  printf("  Hit RETURN to set clip regions in multiple windows: ");
  getchar();
  d1->Clear_Clip();
  clear_whole_window(d1);
  d2->Clear_Clip();
  clear_whole_window(d2);

  perceive_expose_event(d1, 1, 30, 20, 60, 60);
  perceive_expose_event(d1, 0, 10, 100, 100, 50);
  // Since count was zero for d1's last exposure event, you must draw to
  // that window right now (before another exposure event comes in for that
  // window).  This will be programmed into the Exposure event handler.
  d1->Draw_Rectangle(Am_No_Style, purple, 0, 0, 300, 200);

  perceive_expose_event(d2, 1, 200, 20, 60, 60);
  perceive_expose_event(d2, 0, 180, 100, 100, 50);
  d2->Draw_Rectangle(Am_No_Style, green, 0, 0, 300, 200);
  d1->Flush_Output();
  d2->Flush_Output();
}